

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<short,short>(BaseAppender *this,Vector *col,short input)

{
  bool bVar1;
  unkbyte10 Var2;
  short result;
  int16_t local_3a;
  string local_38;
  
  bVar1 = TryCast::Operation<short,short>(input,&local_3a,false);
  if (bVar1) {
    *(int16_t *)(col->data + (this->chunk).count * 2) = local_3a;
    return;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<short,short>
            (&local_38,(duckdb *)(ulong)(uint)(int)input,(short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}